

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  char in_DL;
  uint in_ESI;
  SBuf *in_RDI;
  char *p;
  MSize width;
  uint sz;
  char *local_38;
  uint local_2c;
  char *local_8;
  
  local_2c = in_ESI >> 0x10 & 0xff;
  sz = local_2c;
  if (local_2c < 2) {
    sz = 1;
  }
  if ((in_RDI->e).ptr32 - (in_RDI->p).ptr32 < sz) {
    local_8 = lj_buf_more2(in_RDI,sz);
  }
  else {
    local_8 = (char *)(ulong)(in_RDI->p).ptr32;
  }
  local_38 = local_8;
  if ((in_ESI & 0x100) != 0) {
    local_38 = local_8 + 1;
    *local_8 = in_DL;
  }
  while (1 < local_2c) {
    *local_38 = ' ';
    local_38 = local_38 + 1;
    local_2c = local_2c - 1;
  }
  if ((in_ESI & 0x100) == 0) {
    *local_38 = in_DL;
    local_38 = local_38 + 1;
  }
  (in_RDI->p).ptr32 = (uint32_t)local_38;
  return in_RDI;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *p = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *p++ = (char)c;
  while (width-- > 1) *p++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *p++ = (char)c;
  setsbufP(sb, p);
  return sb;
}